

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::AsyncIoStream,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::getConnectStream(Connection *this)

{
  SourceLocation location;
  bool bVar1;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Own<kj::AsyncIoStream,_std::nullptr_t> *params;
  Array<unsigned_char> *params_1;
  Promise<void> *params_2;
  AsyncIoStream *extraout_RDX;
  long in_RSI;
  Own<kj::AsyncIoStream,_std::nullptr_t> OVar2;
  undefined8 in_stack_fffffffffffffe70;
  Own<kj::AsyncIoStreamWithGuards,_std::nullptr_t> *other;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> local_158;
  undefined1 local_128 [16];
  Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t> local_118;
  undefined1 local_108 [32];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:8079:38)>
  deferNoteClosed;
  ReleasedBuffer releasedBuffer;
  Own<kj::AsyncIoStream,_std::nullptr_t> ownStream;
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Connection *this_local;
  
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                           (in_RSI + 0x188));
  kj::_::DebugExpression<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&>::
  operator==((DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_40,
             (DebugExpression<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&> *)
             &f,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[40]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1f89,FAILED,"tunnelWriteGuard == kj::none",
               "_kjCondition,\"the tunnel stream was already retrieved\"",
               (DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
                *)local_40,(char (*) [40])"the tunnel stream was already retrieved");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  SourceLocation::SourceLocation
            ((SourceLocation *)local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"getConnectStream",0x1f8a,0x10);
  location.function = (char *)local_90._16_8_;
  location.fileName = (char *)local_90._8_8_;
  location.lineNumber = (int)in_stack_fffffffffffffe70;
  location.columnNumber = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  newPromiseAndFulfiller<void>(location);
  t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)&ownStream.ptr,t);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0x188),
             (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)&ownStream.ptr);
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)&ownStream.ptr);
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&releasedBuffer.leftover.size_,
             *(AsyncIoStream **)(in_RSI + 0x20),(Disposer *)&NullDisposer::instance);
  anon_unknown_36::HttpInputStreamImpl::releaseBuffer
            ((ReleasedBuffer *)&deferNoteClosed.maybeFunc.ptr.field_1.value,
             (HttpInputStreamImpl *)(in_RSI + 0x38));
  defer<kj::HttpServer::Connection::getConnectStream()::_lambda()_1_>
            ((kj *)(local_108 + 0x18),(Type *)(local_108 + 0x10));
  params = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&releasedBuffer.leftover.size_);
  params_1 = mv<kj::Array<unsigned_char>>
                       ((Array<unsigned_char> *)&deferNoteClosed.maybeFunc.ptr.field_1.value);
  heap<kj::AsyncIoStreamWithInitialBuffer,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::Array<unsigned_char>,kj::ArrayPtr<unsigned_char>&>
            ((kj *)local_128,params,params_1,
             (ArrayPtr<unsigned_char> *)&releasedBuffer.buffer.disposer);
  mv<kj::_::Deferred<kj::HttpServer::Connection::getConnectStream()::_lambda()_1_>>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:8079:38)>
              *)(local_108 + 0x18));
  Own<kj::AsyncIoStreamWithInitialBuffer,decltype(nullptr)>::
  attach<kj::_::Deferred<kj::HttpServer::Connection::getConnectStream()::_lambda()_1_>>
            ((Own<kj::AsyncIoStreamWithInitialBuffer,decltype(nullptr)> *)(local_128 + 0x10),
             (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:8079:38)>
              *)local_128);
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe(&local_158);
  params_2 = mv<kj::Promise<void>>((Promise<void> *)local_78);
  heap<kj::AsyncIoStreamWithGuards,kj::Own<kj::AsyncIoStreamWithInitialBuffer,decltype(nullptr)>,kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,kj::Promise<void>>
            ((kj *)local_108,
             (Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t> *)(local_128 + 0x10),
             &local_158,params_2);
  other = (Own<kj::AsyncIoStreamWithGuards,_std::nullptr_t> *)local_108;
  Own<kj::AsyncIoStream,decltype(nullptr)>::Own<kj::AsyncIoStreamWithGuards,void>
            ((Own<kj::AsyncIoStream,decltype(nullptr)> *)this,other);
  Own<kj::AsyncIoStreamWithGuards,_std::nullptr_t>::~Own(other);
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::~Maybe(&local_158);
  Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t> *)(local_128 + 0x10));
  Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t> *)local_128);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:8079:38)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:8079:38)>
               *)(local_108 + 0x18));
  anon_unknown_36::HttpInputStreamImpl::ReleasedBuffer::~ReleasedBuffer
            ((ReleasedBuffer *)&deferNoteClosed.maybeFunc.ptr.field_1.value);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&releasedBuffer.leftover.size_);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_78);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<kj::AsyncIoStream> getConnectStream() {
    // Returns an AsyncIoStream over the internal stream but that waits for a Promise to be
    // resolved to allow writes after either accept or reject are called. Reads are allowed
    // immediately.
    KJ_REQUIRE(tunnelWriteGuard == kj::none, "the tunnel stream was already retrieved");
    auto paf = kj::newPromiseAndFulfiller<void>();
    tunnelWriteGuard = kj::mv(paf.fulfiller);

    kj::Own<kj::AsyncIoStream> ownStream(&stream, kj::NullDisposer::instance);
    auto releasedBuffer = httpInput.releaseBuffer();
    auto deferNoteClosed = kj::defer([this]() { webSocketOrConnectClosed = true; });
    return kj::heap<AsyncIoStreamWithGuards>(
        kj::heap<AsyncIoStreamWithInitialBuffer>(
            kj::mv(ownStream),
            kj::mv(releasedBuffer.buffer),
            releasedBuffer.leftover).attach(kj::mv(deferNoteClosed)),
        kj::Maybe<HttpInputStreamImpl::ReleasedBuffer>(kj::none),
        kj::mv(paf.promise));
  }